

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O1

IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_> *
testing::internal::
CheckedDowncastToActualType<testing::internal::CartesianProductGenerator<trust_token_method_st_const*,bool,int,bool>::IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>>const,testing::internal::ParamIteratorInterface<std::tuple<trust_token_method_st_const*,bool,int,bool>>const>
          (ParamIteratorInterface<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_> *base
          )

{
  long lVar1;
  bool bVar2;
  GTestLog local_c;
  
  if (base == (ParamIteratorInterface<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_> *
              )0x0) {
    bVar2 = true;
  }
  else {
    lVar1 = __dynamic_cast(base,&ParamIteratorInterface<std::tuple<trust_token_method_st_const*,bool,int,bool>>
                                 ::typeinfo,
                           &CartesianProductGenerator<trust_token_method_st_const*,bool,int,bool>::
                            IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>>::
                            typeinfo,0);
    bVar2 = lVar1 != 0;
  }
  bVar2 = IsTrue(bVar2);
  if (!bVar2) {
    GTestLog::GTestLog(&local_c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x486);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Condition base == nullptr || dynamic_cast<Derived*>(base) != nullptr failed. ",0x4d)
    ;
    GTestLog::~GTestLog(&local_c);
  }
  return (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_> *)base;
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
  static_assert(std::is_base_of<Base, Derived>::value,
                "target type not derived from source type");
#if GTEST_HAS_RTTI
  GTEST_CHECK_(base == nullptr || dynamic_cast<Derived*>(base) != nullptr);
#endif
  return static_cast<Derived*>(base);
}